

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_TestOptimizedForSize_Test::
~GeneratedMessageTest_TestOptimizedForSize_Test
          (GeneratedMessageTest_TestOptimizedForSize_Test *this)

{
  GeneratedMessageTest_TestOptimizedForSize_Test *this_local;
  
  ~GeneratedMessageTest_TestOptimizedForSize_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, TestOptimizedForSize) {
  // We rely on the tests in reflection_ops_unittest and wire_format_unittest
  // to really test that reflection-based methods work.  Here we are mostly
  // just making sure that TestOptimizedForSize actually builds and seems to
  // function.

  UNITTEST::TestOptimizedForSize message, message2;
  message.set_i(1);
  message.mutable_msg()->set_c(2);
  message2.CopyFrom(message);
  EXPECT_EQ(1, message2.i());
  EXPECT_EQ(2, message2.msg().c());
}